

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_map_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableMapFieldGenerator::GenerateSerializedSizeCode
          (ImmutableMapFieldGenerator *this,Printer *printer)

{
  Printer *printer_local;
  ImmutableMapFieldGenerator *this_local;
  
  io::Printer::Print(printer,&this->variables_,
                     "for (java.util.Map.Entry<$type_parameters$> entry\n     : internalGet$capitalized_name$().getMap().entrySet()) {\n  com.google.protobuf.MapEntry<$type_parameters$>\n  $name$__ = $default_entry$.newBuilderForType()\n      .setKey(entry.getKey())\n      .setValue(entry.getValue())\n      .build();\n  size += com.google.protobuf.CodedOutputStream\n      .computeMessageSize($number$, $name$__);\n}\n"
                    );
  return;
}

Assistant:

void ImmutableMapFieldGenerator::GenerateSerializedSizeCode(
    io::Printer* printer) const {
  printer->Print(
      variables_,
      "for (java.util.Map.Entry<$type_parameters$> entry\n"
      "     : internalGet$capitalized_name$().getMap().entrySet()) {\n"
      "  com.google.protobuf.MapEntry<$type_parameters$>\n"
      "  $name$__ = $default_entry$.newBuilderForType()\n"
      "      .setKey(entry.getKey())\n"
      "      .setValue(entry.getValue())\n"
      "      .build();\n"
      "  size += com.google.protobuf.CodedOutputStream\n"
      "      .computeMessageSize($number$, $name$__);\n"
      "}\n");
}